

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Request * __thiscall
kj::anon_unknown_36::NetworkAddressHttpClient::request
          (Request *__return_storage_ptr__,NetworkAddressHttpClient *this,HttpMethod method,
          StringPtr url,HttpHeaders *headers,Maybe<unsigned_long> *expectedBodySize)

{
  Promise<kj::HttpClient::Response> *dependencyParam;
  AsyncOutputStream *pAVar1;
  PromiseNode *pPVar2;
  PromiseArena *pPVar3;
  PromiseArenaMember *node;
  Maybe<unsigned_long> expectedBodySize_00;
  PromiseArena *pPVar4;
  Disposer *pDVar5;
  void *pvVar6;
  AsyncOutputStream *pAVar7;
  TransformPromiseNodeBase *this_00;
  Refcounted *refcounted_1;
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
  refcounted;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 in_stack_ffffffffffffffa0;
  HttpClient local_50;
  PromiseArena *local_48;
  char local_40;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_38;
  
  getClient((NetworkAddressHttpClient *)&stack0xffffffffffffffb0);
  pPVar4 = local_48;
  local_40 = (expectedBodySize->ptr).isSet;
  if ((bool)local_40 == true) {
    local_38 = (expectedBodySize->ptr).field_1;
  }
  expectedBodySize_00.ptr.field_1.value = in_stack_ffffffffffffffa0.value;
  expectedBodySize_00.ptr._0_8_ = &stack0xffffffffffffffc0;
  HttpClientImpl::request
            (__return_storage_ptr__,*(HttpClientImpl **)(local_48->bytes + 0x20),method,url,headers,
             expectedBodySize_00);
  *(int *)(local_48->bytes + 8) = *(int *)(local_48->bytes + 8) + 1;
  pAVar1 = (__return_storage_ptr__->body).ptr;
  pDVar5 = (Disposer *)operator_new(0x28);
  pDVar5[1]._vptr_Disposer = (_func_int **)local_48;
  pDVar5[2]._vptr_Disposer = (_func_int **)local_48;
  pDVar5[3]._vptr_Disposer = (_func_int **)(__return_storage_ptr__->body).disposer;
  pDVar5[4]._vptr_Disposer = (_func_int **)pAVar1;
  pDVar5->_vptr_Disposer = (_func_int **)&PTR_disposeImpl_0061b708;
  pAVar7 = (AsyncOutputStream *)0x1;
  if (pAVar1 != (AsyncOutputStream *)0x0) {
    pAVar7 = pAVar1;
  }
  (__return_storage_ptr__->body).disposer = pDVar5;
  (__return_storage_ptr__->body).ptr = pAVar7;
  dependencyParam = &__return_storage_ptr__->response;
  local_48 = (PromiseArena *)0x0;
  pPVar2 = (__return_storage_ptr__->response).super_PromiseBase.node.ptr;
  pPVar3 = (pPVar2->super_PromiseArenaMember).arena;
  if (pPVar3 == (PromiseArena *)0x0 || (ulong)((long)pPVar2 - (long)pPVar3) < 0x30) {
    pvVar6 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar6 + 0x3d0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)dependencyParam,
               kj::_::
               SimpleTransformPromiseNode<kj::HttpClient::Response,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:5977:9)>
               ::anon_class_16_1_81fbabb9_for_func::operator());
    *(undefined ***)((long)pvVar6 + 0x3d0) = &PTR_destroy_0061b7f0;
    *(_func_int ***)((long)pvVar6 + 0x3f0) = local_50._vptr_HttpClient;
    *(PromiseArena **)((long)pvVar6 + 0x3f8) = pPVar4;
    *(void **)((long)pvVar6 + 0x3d8) = pvVar6;
  }
  else {
    (pPVar2->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)(pPVar2 + -3);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)dependencyParam,
               kj::_::
               SimpleTransformPromiseNode<kj::HttpClient::Response,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:5977:9)>
               ::anon_class_16_1_81fbabb9_for_func::operator());
    pPVar2[-3].super_PromiseArenaMember._vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_0061b7f0;
    pPVar2[-1].super_PromiseArenaMember._vptr_PromiseArenaMember = local_50._vptr_HttpClient;
    pPVar2[-1].super_PromiseArenaMember.arena = pPVar4;
    pPVar2[-3].super_PromiseArenaMember.arena = pPVar3;
  }
  node = &((dependencyParam->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
  (dependencyParam->super_PromiseBase).node.ptr = &this_00->super_PromiseNode;
  if (node != (PromiseArenaMember *)0x0) {
    kj::_::PromiseDisposer::dispose(node);
  }
  return __return_storage_ptr__;
}

Assistant:

Request request(HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
                  kj::Maybe<uint64_t> expectedBodySize = kj::none) override {
    auto refcounted = getClient();
    auto result = refcounted->client->request(method, url, headers, expectedBodySize);
    result.body = result.body.attach(kj::addRef(*refcounted));
    result.response = result.response.then(
        [refcounted=kj::mv(refcounted)](Response&& response) mutable {
      response.body = response.body.attach(kj::mv(refcounted));
      return kj::mv(response);
    });
    return result;
  }